

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureCompletenessTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::Incomplete2DMissingLevelCase::createTexture
          (Incomplete2DMissingLevelCase *this)

{
  uint uVar1;
  uint uVar2;
  GLenum err;
  uint uVar3;
  int height;
  int iVar4;
  int width;
  int level;
  GLuint texture;
  Vec4 local_98;
  TextureFormat fmt;
  TextureLevel levelData;
  PixelBufferAccess local_58;
  
  fmt = glu::mapGLTransferFormat(0x1908,0x1401);
  tcu::TextureLevel::TextureLevel(&levelData,&fmt);
  glwGenTextures(1,&texture);
  glwPixelStorei(0xcf5,1);
  glwBindTexture(0xde1,texture);
  glwTexParameteri(0xde1,0x2802,0x2901);
  glwTexParameteri(0xde1,0x2803,0x2901);
  glwTexParameteri(0xde1,0x2801,0x2700);
  glwTexParameteri(0xde1,0x2800,0x2600);
  uVar1 = (this->m_size).m_data[0];
  uVar2 = 0x20;
  uVar3 = uVar2;
  if (uVar1 != 0) {
    uVar3 = 0x1f;
    if (uVar1 != 0) {
      for (; uVar1 >> uVar3 == 0; uVar3 = uVar3 - 1) {
      }
    }
    uVar3 = uVar3 ^ 0x1f;
  }
  uVar1 = (this->m_size).m_data[1];
  if (uVar1 != 0) {
    uVar2 = 0x1f;
    if (uVar1 != 0) {
      for (; uVar1 >> uVar2 == 0; uVar2 = uVar2 - 1) {
      }
    }
    uVar2 = uVar2 ^ 0x1f;
  }
  iVar4 = 0x1f - uVar2;
  if ((int)(0x1f - uVar2) < (int)(0x1f - uVar3)) {
    iVar4 = 0x1f - uVar3;
  }
  for (level = 0; iVar4 + 1 != level; level = level + 1) {
    tcu::TextureLevel::setSize(&levelData,(this->m_size).m_data[0],(this->m_size).m_data[1],1);
    tcu::TextureLevel::getAccess(&local_58,&levelData);
    local_98.m_data[0] = 0.0;
    local_98.m_data[1] = 0.0;
    local_98.m_data[2] = 1.0;
    local_98.m_data[3] = 1.0;
    tcu::clear(&local_58,&local_98);
    width = (this->m_size).m_data[0] >> ((byte)level & 0x1f);
    if (width < 2) {
      width = 1;
    }
    height = (this->m_size).m_data[1] >> ((byte)level & 0x1f);
    if (height < 2) {
      height = 1;
    }
    if (level != *(int *)&(this->super_Tex2DCompletenessCase).field_0x84) {
      tcu::TextureLevel::getAccess(&local_58,&levelData);
      glwTexImage2D(0xde1,level,0x1908,width,height,0,0x1908,0x1401,
                    local_58.super_ConstPixelBufferAccess.m_data);
    }
  }
  err = glwGetError();
  glu::checkError(err,"Set texturing state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureCompletenessTests.cpp"
                  ,0x1a3);
  tcu::TextureLevel::~TextureLevel(&levelData);
  return;
}

Assistant:

void Incomplete2DMissingLevelCase::createTexture (void)
{
	tcu::TextureFormat	fmt			= glu::mapGLTransferFormat(GL_RGBA, GL_UNSIGNED_BYTE);
	tcu::TextureLevel	levelData	(fmt);

	GLuint texture;
	glGenTextures	(1, &texture);
	glPixelStorei	(GL_UNPACK_ALIGNMENT, 1);
	glBindTexture	(GL_TEXTURE_2D, texture);

	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S,		GL_REPEAT);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T,		GL_REPEAT);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER,	GL_NEAREST_MIPMAP_NEAREST);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER,	GL_NEAREST);

	int numLevels = 1 + de::max(deLog2Floor32(m_size.x()), deLog2Floor32(m_size.y()));

	for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
	{
		levelData.setSize(m_size.x(), m_size.y());
		clear(levelData.getAccess(), tcu::Vec4(0.0f, 0.0f, 1.0f, 1.0f));

		int	levelW = de::max(1, m_size.x() >> levelNdx);
		int	levelH = de::max(1, m_size.y() >> levelNdx);

		// Skip specified level.
		if (levelNdx != m_missingLevelNdx)
			glTexImage2D(GL_TEXTURE_2D, levelNdx, GL_RGBA, levelW, levelH, 0, GL_RGBA, GL_UNSIGNED_BYTE, levelData.getAccess().getDataPtr());
	}

	GLU_CHECK_MSG("Set texturing state");
}